

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

IndexType GetIndexTypeFromPrimitive
                    (Var indexVar,ScriptContext *scriptContext,uint32 *index,
                    PropertyRecord **propertyRecord,JavascriptString **propertyNameString,
                    bool createIfNotFound,bool preferJavascriptStringOverPropertyRecord)

{
  bool bVar1;
  charcount_t propertyLength_00;
  BOOL BVar2;
  PropertyRecord *pPVar3;
  JavascriptString *this;
  char16 *propertyName_00;
  double value_00;
  JavascriptSymbol *local_c8;
  charcount_t propertyLength;
  char16 *propertyName;
  JavascriptString *indexStr;
  JavascriptSymbol *symbol;
  int iStack_80;
  bool isInt32;
  int32 value;
  charcount_t length;
  int pos;
  char16 stringBuffer [22];
  int indexInt;
  bool preferJavascriptStringOverPropertyRecord_local;
  bool createIfNotFound_local;
  JavascriptString **propertyNameString_local;
  PropertyRecord **propertyRecord_local;
  uint32 *index_local;
  ScriptContext *scriptContext_local;
  Var indexVar_local;
  
  bVar1 = Js::TaggedInt::Is(indexVar);
  if (bVar1) {
    stringBuffer._40_4_ = Js::TaggedInt::ToInt32(indexVar);
    if ((int)stringBuffer._40_4_ < 0) {
      value = Js::TaggedInt::ToBuffer(stringBuffer._40_4_,(char16 *)&length,0x16);
      iStack_80 = 0x15 - value;
      if ((createIfNotFound) || (preferJavascriptStringOverPropertyRecord)) {
        Js::ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,(LPCWSTR)((long)&length + (long)value * 2),iStack_80,propertyRecord
                  );
      }
      else {
        Js::ScriptContext::FindPropertyRecord
                  (scriptContext,(LPCWSTR)((long)&length + (long)value * 2),iStack_80,propertyRecord
                  );
      }
      indexVar_local._4_4_ = IndexType_PropertyId;
    }
    else {
      *index = stringBuffer._40_4_;
      indexVar_local._4_4_ = IndexType_Number;
    }
  }
  else {
    bVar1 = Js::JavascriptNumber::Is_NoTaggedIntCheck(indexVar);
    if (bVar1) {
      symbol._4_4_ = 0;
      symbol._3_1_ = 0;
      value_00 = Js::JavascriptNumber::GetValue(indexVar);
      bVar1 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        (value_00,(int32 *)((long)&symbol + 4),(bool *)((long)&symbol + 3));
      if (((bVar1) && ((symbol._3_1_ & 1) == 0)) && (symbol._4_4_ != 0xffffffff)) {
        *index = symbol._4_4_;
        return IndexType_Number;
      }
    }
    bVar1 = Js::VarIs<Js::JavascriptSymbol>(indexVar);
    if (bVar1) {
      local_c8 = Js::UnsafeVarTo<Js::JavascriptSymbol>(indexVar);
    }
    else {
      local_c8 = (JavascriptSymbol *)0x0;
    }
    if (local_c8 == (JavascriptSymbol *)0x0) {
      this = Js::JavascriptConversion::ToString(indexVar,scriptContext);
      propertyName_00 = Js::JavascriptString::GetString(this);
      propertyLength_00 = Js::JavascriptString::GetLength(this);
      if ((createIfNotFound) || (!preferJavascriptStringOverPropertyRecord)) {
        indexVar_local._4_4_ =
             GetIndexTypeFromString
                       (propertyName_00,propertyLength_00,scriptContext,index,propertyRecord,
                        createIfNotFound);
      }
      else {
        BVar2 = Js::JavascriptOperators::TryConvertToUInt32(propertyName_00,propertyLength_00,index)
        ;
        if ((BVar2 == 0) || (*index == 0xffffffff)) {
          *propertyNameString = this;
          indexVar_local._4_4_ = IndexType_JavascriptString;
        }
        else {
          indexVar_local._4_4_ = IndexType_Number;
        }
      }
    }
    else {
      pPVar3 = Js::JavascriptSymbol::GetValue(local_c8);
      *propertyRecord = pPVar3;
      indexVar_local._4_4_ = IndexType_PropertyId;
    }
  }
  return indexVar_local._4_4_;
}

Assistant:

IndexType GetIndexTypeFromPrimitive(Var indexVar, ScriptContext* scriptContext, uint32* index, PropertyRecord const ** propertyRecord, JavascriptString ** propertyNameString, bool createIfNotFound, bool preferJavascriptStringOverPropertyRecord)
    {
        // CONSIDER: Only OP_SetElementI and OP_GetElementI use and take advantage of the
        // IndexType_JavascriptString result. Consider modifying other callers of GetIndexType to take
        // advantage of non-interned property strings where appropriate.
        if (TaggedInt::Is(indexVar))
        {
            int indexInt = TaggedInt::ToInt32(indexVar);
            if (indexInt >= 0)
            {
                *index = (uint)indexInt;
                return IndexType_Number;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(indexInt, stringBuffer, _countof(stringBuffer));
                charcount_t length = (_countof(stringBuffer) - 1) - pos;
                if (createIfNotFound || preferJavascriptStringOverPropertyRecord)
                {
                    // When preferring JavascriptString objects, just return a PropertyRecord instead
                    // of creating temporary JavascriptString objects for every negative integer that
                    // comes through here.
                    scriptContext->GetOrAddPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                else
                {
                    scriptContext->FindPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                return IndexType_PropertyId;
            }
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(indexVar))
        {
            // If this double can be a positive integer index, convert it.
            int32 value = 0;
            bool isInt32 = false;
            if (JavascriptNumber::TryGetInt32OrUInt32Value(JavascriptNumber::GetValue(indexVar), &value, &isInt32)
                && !isInt32
                && static_cast<uint32>(value) < JavascriptArray::InvalidIndex)
            {
                *index = static_cast<uint32>(value);
                return IndexType_Number;
            }

            // Fall through to slow string conversion.
        }

        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(indexVar);
        if (symbol)
        {
            // JavascriptSymbols cannot add a new PropertyRecord - they correspond to one and only one existing PropertyRecord.
            // We already know what the PropertyRecord is since it is stored in the JavascriptSymbol itself so just return it.

            *propertyRecord = symbol->GetValue();
            return IndexType_PropertyId;
        }
        else
        {
            JavascriptString* indexStr = JavascriptConversion::ToString(indexVar, scriptContext);

            char16 const * propertyName = indexStr->GetString();
            charcount_t const propertyLength = indexStr->GetLength();

            if (!createIfNotFound && preferJavascriptStringOverPropertyRecord)
            {
                if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
                    (*index != JavascriptArray::InvalidIndex))
                {
                    return IndexType_Number;
                }

                *propertyNameString = indexStr;
                return IndexType_JavascriptString;
            }
            return GetIndexTypeFromString(propertyName, propertyLength, scriptContext, index, propertyRecord, createIfNotFound);
        }
    }